

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse.cpp
# Opt level: O3

uint sparse_count_chunks(sparse_file *s)

{
  uint uVar1;
  uint uVar2;
  backed_block *bb;
  ulong uVar3;
  int iVar4;
  
  bb = backed_block_iter_new(s->backed_block_list);
  if (bb == (backed_block *)0x0) {
    uVar3 = 0;
    iVar4 = 0;
  }
  else {
    iVar4 = 0;
    uVar2 = 0;
    do {
      uVar1 = backed_block_block(bb);
      iVar4 = iVar4 + 1 + (uint)(uVar2 < uVar1);
      uVar2 = backed_block_block(bb);
      uVar1 = backed_block_len(bb);
      uVar2 = ((uVar1 + s->block_size) - 1) / s->block_size + uVar2;
      bb = backed_block_iter_next(bb);
    } while (bb != (backed_block *)0x0);
    uVar3 = (ulong)uVar2;
  }
  return (uint)((long)uVar3 <
               (long)(s->len + (ulong)s->block_size + -1) / (long)(ulong)s->block_size) + iVar4;
}

Assistant:

unsigned int sparse_count_chunks(struct sparse_file* s) {
  struct backed_block* bb;
  unsigned int last_block = 0;
  unsigned int chunks = 0;

  for (bb = backed_block_iter_new(s->backed_block_list); bb; bb = backed_block_iter_next(bb)) {
    if (backed_block_block(bb) > last_block) {
      /* If there is a gap between chunks, add a skip chunk */
      chunks++;
    }
    chunks++;
    last_block = backed_block_block(bb) + DIV_ROUND_UP(backed_block_len(bb), s->block_size);
  }
  if (last_block < DIV_ROUND_UP(s->len, s->block_size)) {
    chunks++;
  }

  return chunks;
}